

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

BOOLEAN __thiscall
BVSparse<Memory::ArenaAllocator>::Test(BVSparse<Memory::ArenaAllocator> *this,BVIndex i)

{
  BOOLEAN BVar1;
  SparseBVUnit *this_00;
  
  this_00 = BitsFromIndex(this,i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,i & 0x3f);
  return BVar1;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::Test(BVIndex i) const
{
    return this->BitsFromIndex(i)->Test(SparseBVUnit::Offset(i));
}